

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O1

void duckdb::StringColumnReader::VerifyString(char *str_data,uint32_t str_len,bool is_varchar)

{
  UnicodeType UVar1;
  InvalidInputException *this;
  long *plVar2;
  size_t *invalid_pos;
  size_type *psVar3;
  undefined7 in_register_00000011;
  string_t blob;
  UnicodeInvalidReason reason;
  size_t pos;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  UnicodeInvalidReason local_8c;
  string local_88;
  size_t local_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000011,is_varchar) != 0) {
    invalid_pos = &local_68;
    UVar1 = Utf8Proc::Analyze(str_data,(ulong)str_len,&local_8c,invalid_pos);
    if (UVar1 == INVALID) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      if (str_len < 0xd) {
        uStack_98._4_4_ = 0;
        uStack_9c = 0;
        uStack_98._0_4_ = 0;
        uStack_98 = (char *)0x0;
        if (str_len != 0) {
          switchD_00b1422a::default(&uStack_9c,str_data,(ulong)str_len);
          uStack_98 = (char *)CONCAT44(uStack_98._4_4_,(undefined4)uStack_98);
        }
      }
      else {
        uStack_9c = *(undefined4 *)str_data;
        uStack_98 = str_data;
      }
      blob.value.pointer.ptr = (char *)invalid_pos;
      blob.value._0_8_ = uStack_98;
      Blob::ToString_abi_cxx11_(&local_60,(Blob *)CONCAT44(uStack_9c,str_len),blob);
      ::std::operator+(&local_40,"Invalid string encoding found in Parquet file: value \"",&local_60
                      );
      plVar2 = (long *)::std::__cxx11::string::append((char *)&local_40);
      local_88._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar3) {
        local_88.field_2._M_allocated_capacity = *psVar3;
        local_88.field_2._8_8_ = plVar2[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar3;
      }
      local_88._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      InvalidInputException::InvalidInputException(this,&local_88);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringColumnReader::VerifyString(const char *str_data, uint32_t str_len, const bool is_varchar) {
	if (!is_varchar) {
		return;
	}
	// verify if a string is actually UTF8, and if there are no null bytes in the middle of the string
	// technically Parquet should guarantee this, but reality is often disappointing
	UnicodeInvalidReason reason;
	size_t pos;
	auto utf_type = Utf8Proc::Analyze(str_data, str_len, &reason, &pos);
	if (utf_type == UnicodeType::INVALID) {
		throw InvalidInputException("Invalid string encoding found in Parquet file: value \"" +
		                            Blob::ToString(string_t(str_data, str_len)) + "\" is not valid UTF8!");
	}
}